

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# N.cpp
# Opt level: O2

nodeit * __thiscall N::operator[](nodeit *__return_storage_ptr__,N *this,nodeit ps_)

{
  pointer ppNVar1;
  __normal_iterator<N_**,_std::vector<N_*,_std::allocator<N_*>_>_> _Var2;
  __normal_iterator<N_**,_std::vector<N_*,_std::allocator<N_*>_>_> _Var3;
  uint uVar4;
  nodeit *pnVar5;
  CIt<__gnu_cxx::__normal_iterator<N_**,_std::vector<N_*,_std::allocator<N_*>_>_>,_N> *pCVar6;
  __normal_iterator<N_**,_std::vector<N_*,_std::allocator<N_*>_>_> _Var7;
  nodeit *pnVar8;
  N **local_88;
  nodeit local_70;
  CIt<__gnu_cxx::__normal_iterator<N_**,_std::vector<N_*,_std::allocator<N_*>_>_>,_N> __end1;
  
  uVar4 = CIt<__gnu_cxx::__normal_iterator<N_**,_std::vector<N_*,_std::allocator<N_*>_>_>,_N>::size
                    (&ps_);
  _Var7 = ps_._start;
  if (uVar4 == 0) {
    ppNVar1 = (this->os).super__Vector_base<N_*,_std::allocator<N_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    (__return_storage_ptr__->_start)._M_current = ppNVar1;
    (__return_storage_ptr__->_end)._M_current = ppNVar1;
    (__return_storage_ptr__->_curr)._M_current = ppNVar1;
    __return_storage_ptr__->next =
         (CIt<__gnu_cxx::__normal_iterator<N_**,_std::vector<N_*,_std::allocator<N_*>_>_>,_N> *)0x0;
  }
  else {
    operator[](__return_storage_ptr__,this,*ps_._start._M_current);
    pCVar6 = ps_.next;
    local_88 = ps_._end._M_current;
    CIt<__gnu_cxx::__normal_iterator<N_**,_std::vector<N_*,_std::allocator<N_*>_>_>,_N>::end
              (&__end1,&ps_);
    pnVar8 = __return_storage_ptr__;
    while ((_Var7._M_current != __end1._curr._M_current || (pCVar6 != __end1.next))) {
      pnVar5 = pnVar8;
      if (*_Var7._M_current != *ps_._start._M_current) {
        operator[](&local_70,this,*_Var7._M_current);
        _Var3._M_current = local_70._end._M_current;
        _Var2._M_current = local_70._start._M_current;
        pnVar5 = (nodeit *)::operator_new(0x20);
        (pnVar5->_start)._M_current = _Var2._M_current;
        (pnVar5->_end)._M_current = _Var3._M_current;
        (pnVar5->_curr)._M_current = _Var2._M_current;
        pnVar5->next = (CIt<__gnu_cxx::__normal_iterator<N_**,_std::vector<N_*,_std::allocator<N_*>_>_>,_N>
                        *)0x0;
        pnVar8->next = pnVar5;
      }
      _Var7._M_current = _Var7._M_current + 1;
      pnVar8 = pnVar5;
      if ((pCVar6 != (CIt<__gnu_cxx::__normal_iterator<N_**,_std::vector<N_*,_std::allocator<N_*>_>_>,_N>
                      *)0x0) && (_Var7._M_current == local_88)) {
        local_88 = (pCVar6->_end)._M_current;
        _Var7._M_current = (pCVar6->_curr)._M_current;
        pCVar6 = pCVar6->next;
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

nodeit N::operator[](nodeit ps_) {
    if (ps_.size() == 0) return nodeit(os.end(), os.end());

    auto start_it = (*this)[*ps_.begin()];

    auto last = &start_it;
    for (auto p : ps_)
        if (p != *ps_.begin())
            last = last->chain((*this)[p]);

    return start_it;
}